

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo::GLSLStubInfo
          (GLSLStubInfo *this,String *_Name,char *_Swizzle)

{
  char *pcVar1;
  allocator local_21;
  char *local_20;
  char *_Swizzle_local;
  String *_Name_local;
  GLSLStubInfo *this_local;
  
  local_20 = _Swizzle;
  _Swizzle_local = (char *)_Name;
  _Name_local = &this->Name;
  std::__cxx11::string::string((string *)this,(string *)_Name);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Swizzle,pcVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return;
}

Assistant:

GLSLStubInfo(const String& _Name, const char* _Swizzle) :
            Name{_Name},
            Swizzle{_Swizzle}
        {}